

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void yy_parse_failed(yyParser *yypParser)

{
  simple_token **ppsVar1;
  simple_token **result;
  yyParser *yypParser_local;
  
  ppsVar1 = yypParser->result;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sFail!\n",yyTracePrompt);
  }
  while (yypParser->yystack < yypParser->yytos) {
    yy_pop_parser_stack(yypParser);
  }
  fprintf(_stderr,"Parser failed to successfully parse.\n");
  yypParser->result = ppsVar1;
  return;
}

Assistant:

static void yy_parse_failed(
	yyParser * yypParser          /* The parser */
) {
	TDPParseARG_FETCH;
#ifndef NDEBUG

	if ( yyTraceFILE ) {
		fprintf(yyTraceFILE, "%sFail!\n", yyTracePrompt);
	}

#endif

	while ( yypParser->yytos > yypParser->yystack ) {
		yy_pop_parser_stack(yypParser);
	}

	/* Here code is inserted which will be executed whenever the
	** parser fails */
	/************ Begin %parse_failure code ***************************************/

	fprintf(stderr, "Parser failed to successfully parse.\n");
	/************ End %parse_failure code *****************************************/
	TDPParseARG_STORE; /* Suppress warning about unused %extra_argument variable */
}